

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboNoAttachmentTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_0::checkFramebufferSize
               (TestLog *log,RenderContext *renderCtx,GLuint framebuffer,IVec2 *size)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deBool dVar4;
  deUint32 dVar5;
  int iVar6;
  undefined4 extraout_var;
  TestError *pTVar8;
  MessageBuilder *pMVar9;
  byte local_d35;
  char *local_bc0;
  int local_bb8;
  int local_bb4;
  MessageBuilder local_bb0;
  char *local_a30;
  int local_a28;
  int local_a24;
  MessageBuilder local_a20;
  char *local_8a0;
  int local_898;
  int local_894;
  MessageBuilder local_890;
  undefined4 local_710;
  undefined4 local_70c;
  GLuint vertexBuffer;
  GLuint vertexArray;
  float data [12];
  MessageBuilder local_558;
  int local_3d8;
  int local_3d4;
  MessageBuilder local_3d0;
  int local_24c;
  int local_248;
  GLuint outsideYPassed;
  GLuint outsideXPassed;
  GLuint insidePassed;
  GLuint query;
  allocator<char> local_201;
  string local_200;
  ProgramSources local_1e0;
  undefined1 local_110 [8];
  ShaderProgram program;
  char *fragmentSource;
  char *vertexSource;
  Functions *gl;
  IVec2 *size_local;
  GLuint framebuffer_local;
  RenderContext *renderCtx_local;
  TestLog *log_local;
  long lVar7;
  
  iVar3 = (*renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar3);
  program.m_program.m_info.linkTimeUs = (deUint64)anon_var_dwarf_1c5435d;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,
             "#version 310 es\nin layout(location = 0) highp vec2 a_position;\n\nvoid main()\n{\n\tgl_Position = vec4(a_position, 0.0, 1.0);\n}\n"
             ,&local_201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&query,
             "#version 310 es\nuniform layout(location = 0) highp ivec2 u_expectedSize;\nout layout(location = 0) mediump vec4 f_color;\n\nvoid main()\n{\n\tif (ivec2(gl_FragCoord.xy) != u_expectedSize) discard;\n\tf_color = vec4(1.0, 0.5, 0.25, 1.0);\n}\n"
             ,(allocator<char> *)((long)&insidePassed + 3));
  glu::makeVtxFragSources(&local_1e0,&local_200,(string *)&query);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_110,renderCtx,&local_1e0);
  glu::ProgramSources::~ProgramSources(&local_1e0);
  std::__cxx11::string::~string((string *)&query);
  std::allocator<char>::~allocator((allocator<char> *)((long)&insidePassed + 3));
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  outsideXPassed = 0;
  outsideYPassed = 0;
  local_248 = 0;
  local_24c = 0;
  bVar2 = glu::ShaderProgram::isOk((ShaderProgram *)local_110);
  if (!bVar2) {
    glu::operator<<(log,(ShaderProgram *)local_110);
  }
  while ((dVar4 = ::deGetFalse(), dVar4 == 0 &&
         (bVar2 = glu::ShaderProgram::isOk((ShaderProgram *)local_110), bVar2))) {
    dVar4 = ::deGetFalse();
    if (dVar4 == 0) {
      pcVar1 = *(code **)(lVar7 + 0x1680);
      dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_110);
      (*pcVar1)(dVar5);
      (**(code **)(lVar7 + 0x5e0))(0xb71);
      (**(code **)(lVar7 + 0x4a0))(0x207);
      (**(code **)(lVar7 + 0x78))(0x8ca9,framebuffer);
      pcVar1 = *(code **)(lVar7 + 0x1a00);
      iVar3 = tcu::Vector<int,_2>::x(size);
      iVar6 = tcu::Vector<int,_2>::y(size);
      (*pcVar1)(0,0,iVar3 * 2,iVar6 * 2);
      tcu::TestLog::operator<<(&local_3d0,log,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<(&local_3d0,(char (*) [7])"Using ");
      local_3d4 = tcu::Vector<int,_2>::x(size);
      local_3d4 = local_3d4 * 2;
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_3d4);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x2a9098a);
      local_3d8 = tcu::Vector<int,_2>::y(size);
      local_3d8 = local_3d8 * 2;
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_3d8);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [10])0x2b45f7e);
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_3d0);
      tcu::TestLog::operator<<(&local_558,log,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<
                         (&local_558,(char (*) [47])"Discarding fragments outside pixel of interest"
                         );
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_558);
      tcu::TestLog::operator<<
                ((MessageBuilder *)(data + 10),log,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)(data + 10),
                          (char (*) [54])"Using occlusion query to check for rendered fragments");
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)(data + 10));
      while ((dVar4 = ::deGetFalse(), dVar4 == 0 &&
             (iVar3 = (**(code **)(lVar7 + 0x170))(0x8ca9), iVar3 == 0x8cd5))) {
        dVar4 = ::deGetFalse();
        if (dVar4 == 0) {
          data[6] = 1.0;
          data[7] = -1.0;
          data[8] = -1.0;
          data[9] = -1.0;
          data[2] = -1.0;
          data[3] = 1.0;
          data[4] = -1.0;
          data[5] = 1.0;
          vertexBuffer = 0x3f800000;
          vertexArray = 0x3f800000;
          data[0] = 1.0;
          data[1] = -1.0;
          local_70c = 0;
          local_710 = 0;
          (**(code **)(lVar7 + 0x6e0))(1,&outsideXPassed);
          (**(code **)(lVar7 + 0x708))(1,&local_70c);
          (**(code **)(lVar7 + 0xd8))(local_70c);
          (**(code **)(lVar7 + 0x6c8))(1,&local_710);
          (**(code **)(lVar7 + 0x40))(0x8892,local_710);
          (**(code **)(lVar7 + 0x150))(0x8892,0x30,&vertexBuffer,0x88e4);
          (**(code **)(lVar7 + 0x610))(0);
          (**(code **)(lVar7 + 0x19f0))(0,2,0x1406,0,0,0);
          pcVar1 = *(code **)(lVar7 + 0x1530);
          iVar3 = tcu::Vector<int,_2>::x(size);
          iVar6 = tcu::Vector<int,_2>::y(size);
          (*pcVar1)(0,iVar3 + -1,iVar6 + -1);
          (**(code **)(lVar7 + 0x20))(0x8c2f,outsideXPassed);
          (**(code **)(lVar7 + 0x538))(4,0,6);
          (**(code **)(lVar7 + 0x628))(0x8c2f);
          (**(code **)(lVar7 + 0xa20))(outsideXPassed,0x8866,&outsideYPassed);
          tcu::TestLog::operator<<(&local_890,log,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar9 = tcu::MessageBuilder::operator<<
                             (&local_890,(char (*) [34])"A fragment was not discarded at (");
          local_894 = tcu::Vector<int,_2>::x(size);
          local_894 = local_894 + -1;
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_894);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2a4b1eb);
          local_898 = tcu::Vector<int,_2>::y(size);
          local_898 = local_898 + -1;
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_898);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [4])"). ");
          pMVar9 = tcu::MessageBuilder::operator<<
                             (pMVar9,(char (*) [32])"Occlusion query reports it was ");
          local_8a0 = "not rendered";
          if (outsideYPassed != 0) {
            local_8a0 = "rendered.";
          }
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_8a0);
          tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_890);
          pcVar1 = *(code **)(lVar7 + 0x1530);
          iVar3 = tcu::Vector<int,_2>::x(size);
          iVar6 = tcu::Vector<int,_2>::y(size);
          (*pcVar1)(0,iVar3,iVar6 + -1);
          (**(code **)(lVar7 + 0x20))(0x8c2f,outsideXPassed);
          (**(code **)(lVar7 + 0x538))(4,0,6);
          (**(code **)(lVar7 + 0x628))(0x8c2f);
          (**(code **)(lVar7 + 0xa20))(outsideXPassed,0x8866,&local_248);
          tcu::TestLog::operator<<(&local_a20,log,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar9 = tcu::MessageBuilder::operator<<
                             (&local_a20,(char (*) [34])"A fragment was not discarded at (");
          local_a24 = tcu::Vector<int,_2>::x(size);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_a24);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2a4b1eb);
          local_a28 = tcu::Vector<int,_2>::y(size);
          local_a28 = local_a28 + -1;
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_a28);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [4])"). ");
          pMVar9 = tcu::MessageBuilder::operator<<
                             (pMVar9,(char (*) [32])"Occlusion query reports it was ");
          local_a30 = "not rendered";
          if (local_248 != 0) {
            local_a30 = "rendered.";
          }
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_a30);
          tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_a20);
          pcVar1 = *(code **)(lVar7 + 0x1530);
          iVar3 = tcu::Vector<int,_2>::x(size);
          iVar6 = tcu::Vector<int,_2>::y(size);
          (*pcVar1)(0,iVar3 + -1,iVar6);
          (**(code **)(lVar7 + 0x20))(0x8c2f,outsideXPassed);
          (**(code **)(lVar7 + 0x538))(4,0,6);
          (**(code **)(lVar7 + 0x628))(0x8c2f);
          (**(code **)(lVar7 + 0xa20))(outsideXPassed,0x8866,&local_24c);
          tcu::TestLog::operator<<(&local_bb0,log,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar9 = tcu::MessageBuilder::operator<<
                             (&local_bb0,(char (*) [34])"A fragment was not discarded at (");
          local_bb4 = tcu::Vector<int,_2>::x(size);
          local_bb4 = local_bb4 + -1;
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_bb4);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2a4b1eb);
          local_bb8 = tcu::Vector<int,_2>::y(size);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_bb8);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [4])"). ");
          pMVar9 = tcu::MessageBuilder::operator<<
                             (pMVar9,(char (*) [32])"Occlusion query reports it was ");
          local_bc0 = "not rendered";
          if (local_24c != 0) {
            local_bc0 = "rendered.";
          }
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_bc0);
          tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_bb0);
          (**(code **)(lVar7 + 0x518))(0);
          (**(code **)(lVar7 + 0x40))(0x8892,0);
          (**(code **)(lVar7 + 0xd8))(0);
          (**(code **)(lVar7 + 0x438))(1,&local_710);
          (**(code **)(lVar7 + 0x490))(1,&local_70c);
          (**(code **)(lVar7 + 0x458))(1,&outsideXPassed);
          dVar5 = (**(code **)(lVar7 + 0x800))();
          glu::checkError(dVar5,"Query failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fFboNoAttachmentTests.cpp"
                          ,0xa9);
          local_d35 = 0;
          if ((outsideYPassed != 0) && (local_d35 = 0, local_248 == 0)) {
            local_d35 = local_24c != 0 ^ 0xff;
          }
          glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_110);
          return (bool)(local_d35 & 1);
        }
      }
      pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar8,(char *)0x0,
                 "gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fFboNoAttachmentTests.cpp"
                 ,0x6c);
      __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar8,(char *)0x0,"program.isOk()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fFboNoAttachmentTests.cpp"
             ,0x60);
  __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

bool checkFramebufferSize (TestLog& log, const glu::RenderContext& renderCtx, GLuint framebuffer, const IVec2& size)
{
	const glw::Functions&		gl				= renderCtx.getFunctions();

	const char* const			vertexSource	= "#version 310 es\n"
												  "in layout(location = 0) highp vec2 a_position;\n\n"
												  "void main()\n"
												  "{\n"
												  "	gl_Position = vec4(a_position, 0.0, 1.0);\n"
												  "}\n";

	const char* const			fragmentSource	= "#version 310 es\n"
												  "uniform layout(location = 0) highp ivec2 u_expectedSize;\n"
												  "out layout(location = 0) mediump vec4 f_color;\n\n"
												  "void main()\n"
												  "{\n"
												  "	if (ivec2(gl_FragCoord.xy) != u_expectedSize) discard;\n"
												  "	f_color = vec4(1.0, 0.5, 0.25, 1.0);\n"
												  "}\n";

	const glu::ShaderProgram	program			(renderCtx, glu::makeVtxFragSources(vertexSource, fragmentSource));
	GLuint						query			= 0;
	GLuint						insidePassed	= 0;
	GLuint						outsideXPassed	= 0;
	GLuint						outsideYPassed	= 0;

	if (!program.isOk())
		log << program;

	TCU_CHECK(program.isOk());

	gl.useProgram(program.getProgram());
	gl.enable(GL_DEPTH_TEST);
	gl.depthFunc(GL_ALWAYS);
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, framebuffer);
	gl.viewport(0, 0, size.x()*2, size.y()*2); // Oversized viewport so that it will not accidentally limit us to the correct size

	log << TestLog::Message << "Using " << size.x()*2 << "x" << size.y()*2 << " viewport" << TestLog::EndMessage;
	log << TestLog::Message << "Discarding fragments outside pixel of interest" << TestLog::EndMessage;
	log << TestLog::Message << "Using occlusion query to check for rendered fragments" << TestLog::EndMessage;

	TCU_CHECK(gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);

	// Render
	{
		const float data[] =
		{
			 1.0f,  1.0f,
			 1.0f, -1.0f,
			-1.0f,  1.0f,
			-1.0f,  1.0f,
			 1.0f, -1.0f,
			-1.0f, -1.0f,
		};

		GLuint vertexArray	= 0;
		GLuint vertexBuffer	= 0;

		gl.genQueries(1, &query);
		gl.genVertexArrays(1, &vertexArray);
		gl.bindVertexArray(vertexArray);

		gl.genBuffers(1, &vertexBuffer);
		gl.bindBuffer(GL_ARRAY_BUFFER, vertexBuffer);
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);

		gl.enableVertexAttribArray(0);
		gl.vertexAttribPointer(0, 2, GL_FLOAT, false, 0, DE_NULL);

		gl.uniform2i(0, size.x()-1, size.y()-1);
		gl.beginQuery(GL_ANY_SAMPLES_PASSED, query);
		gl.drawArrays(GL_TRIANGLES, 0, 6);
		gl.endQuery(GL_ANY_SAMPLES_PASSED);
		gl.getQueryObjectuiv(query, GL_QUERY_RESULT, &insidePassed);
		log << TestLog::Message << "A fragment was not discarded at (" << size.x()-1 << ", " << size.y()-1 << "). "
			<< "Occlusion query reports it was " << (insidePassed > 0 ? "rendered." : "not rendered") << TestLog::EndMessage;

		gl.uniform2i(0, size.x(), size.y()-1);
		gl.beginQuery(GL_ANY_SAMPLES_PASSED, query);
		gl.drawArrays(GL_TRIANGLES, 0, 6);
		gl.endQuery(GL_ANY_SAMPLES_PASSED);
		gl.getQueryObjectuiv(query, GL_QUERY_RESULT, &outsideXPassed);
		log << TestLog::Message << "A fragment was not discarded at (" << size.x() << ", " << size.y()-1 << "). "
			<< "Occlusion query reports it was " << (outsideXPassed > 0 ? "rendered." : "not rendered") << TestLog::EndMessage;

		gl.uniform2i(0, size.x()-1, size.y());
		gl.beginQuery(GL_ANY_SAMPLES_PASSED, query);
		gl.drawArrays(GL_TRIANGLES, 0, 6);
		gl.endQuery(GL_ANY_SAMPLES_PASSED);
		gl.getQueryObjectuiv(query, GL_QUERY_RESULT, &outsideYPassed);
		log << TestLog::Message << "A fragment was not discarded at (" << size.x()-1 << ", " << size.y() << "). "
			<< "Occlusion query reports it was " << (outsideYPassed > 0 ? "rendered." : "not rendered") << TestLog::EndMessage;

		gl.disableVertexAttribArray(0);
		gl.bindBuffer(GL_ARRAY_BUFFER, 0);
		gl.bindVertexArray(0);
		gl.deleteBuffers(1, &vertexBuffer);
		gl.deleteVertexArrays(1, &vertexArray);
	}

	gl.deleteQueries(1, &query);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Query failed");

	return insidePassed && !outsideXPassed && !outsideYPassed;
}